

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void * __thiscall
google::protobuf::Reflection::MutableRawRepeatedField
          (Reflection *this,Message *message,FieldDescriptor *field,CppType cpptype,int ctype,
          Descriptor *desc)

{
  FieldType field_type;
  int number;
  byte bVar1;
  bool bVar2;
  uint32_t uVar3;
  Descriptor *pDVar4;
  MapFieldBase *this_00;
  RepeatedPtrFieldBase *pRVar5;
  void *pvVar6;
  Descriptor *extraout_RAX;
  Nonnull<const_char_*> failure_msg;
  char *description;
  char *method;
  Descriptor *unaff_R12;
  LogMessage LStack_38;
  
  bVar1 = field->field_0x1;
  if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
    MutableRawRepeatedField();
    pDVar4 = extraout_RAX;
LAB_001f4a94:
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                            (pDVar4,unaff_R12,"field->message_type() == desc");
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0xac7,failure_msg);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&LStack_38,(char (*) [22])"wrong submessage type");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&LStack_38);
  }
  if ((bVar1 & 0x20) == 0) {
    pDVar4 = this->descriptor_;
    method = "\"MutableRawRepeatedField\"";
    description = "Field is singular; the method requires a repeated field.";
  }
  else {
    pDVar4 = this->descriptor_;
    if (field->containing_type_ == pDVar4) {
      if ((*(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != cpptype) &&
         ((cpptype != CPPTYPE_INT32 ||
          (*(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) !=
           CPPTYPE_ENUM)))) {
        anon_unknown_6::ReportReflectionUsageTypeError
                  (pDVar4,field,"MutableRawRepeatedField",cpptype);
      }
      if (desc != (Descriptor *)0x0) {
        pDVar4 = FieldDescriptor::message_type(field);
        unaff_R12 = desc;
        if (pDVar4 != desc) goto LAB_001f4a94;
        bVar1 = field->field_0x1;
      }
      if ((bVar1 & 8) != 0) {
        uVar3 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        number = field->number_;
        field_type = field->type_;
        bVar2 = FieldDescriptor::is_packed(field);
        pvVar6 = internal::ExtensionSet::MutableRawRepeatedField
                           ((ExtensionSet *)
                            ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),
                            number,field_type,bVar2,field);
        return pvVar6;
      }
      if (field->type_ == '\v') {
        bVar2 = FieldDescriptor::is_map_message_type(field);
        if (bVar2) {
          VerifyFieldType<google::protobuf::internal::MapFieldBase>(this,field);
          this_00 = (MapFieldBase *)MutableRawNonOneofImpl(this,message,field);
          pRVar5 = internal::MapFieldBase::MutableRepeatedField(this_00);
          return pRVar5;
        }
      }
      pvVar6 = MutableRawNonOneofImpl(this,message,field);
      return pvVar6;
    }
    method = "MutableRawRepeatedField";
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar4,field,method,description);
}

Assistant:

void* Reflection::MutableRawRepeatedField(Message* message,
                                          const FieldDescriptor* field,
                                          FieldDescriptor::CppType cpptype,
                                          int ctype,
                                          const Descriptor* desc) const {
  (void)ctype;  // Parameter is used by Google-internal code.
  USAGE_CHECK_REPEATED("MutableRawRepeatedField");
  USAGE_CHECK_MESSAGE_TYPE(MutableRawRepeatedField);

  if (field->cpp_type() != cpptype &&
      (field->cpp_type() != FieldDescriptor::CPPTYPE_ENUM ||
       cpptype != FieldDescriptor::CPPTYPE_INT32))
    ReportReflectionUsageTypeError(descriptor_, field,
                                   "MutableRawRepeatedField", cpptype);
  if (desc != nullptr)
    ABSL_CHECK_EQ(field->message_type(), desc) << "wrong submessage type";
  if (field->is_extension()) {
    return MutableExtensionSet(message)->MutableRawRepeatedField(
        field->number(), field->type(), field->is_packed(), field);
  } else {
    // Trigger transform for MapField
    if (IsMapFieldInApi(field)) {
      return MutableRawNonOneof<MapFieldBase>(message, field)
          ->MutableRepeatedField();
    }
    return MutableRawNonOneof<void>(message, field);
  }
}